

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

PolicyID policyForString(char *policy_id)

{
  PolicyID PVar1;
  int iVar2;
  
  iVar2 = strcmp(policy_id,"CMP0003");
  if (iVar2 == 0) {
    PVar1 = CMP0003;
  }
  else {
    iVar2 = strcmp(policy_id,"CMP0004");
    if (iVar2 == 0) {
      PVar1 = CMP0004;
    }
    else {
      iVar2 = strcmp(policy_id,"CMP0008");
      if (iVar2 == 0) {
        PVar1 = CMP0008;
      }
      else {
        iVar2 = strcmp(policy_id,"CMP0020");
        if (iVar2 == 0) {
          PVar1 = CMP0020;
        }
        else {
          iVar2 = strcmp(policy_id,"CMP0021");
          if (iVar2 == 0) {
            PVar1 = CMP0021;
          }
          else {
            iVar2 = strcmp(policy_id,"CMP0022");
            if (iVar2 == 0) {
              PVar1 = CMP0022;
            }
            else {
              iVar2 = strcmp(policy_id,"CMP0027");
              if (iVar2 == 0) {
                PVar1 = CMP0027;
              }
              else {
                iVar2 = strcmp(policy_id,"CMP0038");
                if (iVar2 == 0) {
                  PVar1 = CMP0038;
                }
                else {
                  iVar2 = strcmp(policy_id,"CMP0041");
                  if (iVar2 == 0) {
                    PVar1 = CMP0041;
                  }
                  else {
                    iVar2 = strcmp(policy_id,"CMP0042");
                    if (iVar2 == 0) {
                      PVar1 = CMP0042;
                    }
                    else {
                      iVar2 = strcmp(policy_id,"CMP0046");
                      if (iVar2 == 0) {
                        PVar1 = CMP0046;
                      }
                      else {
                        iVar2 = strcmp(policy_id,"CMP0052");
                        if (iVar2 == 0) {
                          PVar1 = CMP0052;
                        }
                        else {
                          iVar2 = strcmp(policy_id,"CMP0060");
                          if (iVar2 == 0) {
                            PVar1 = CMP0060;
                          }
                          else {
                            iVar2 = strcmp(policy_id,"CMP0063");
                            if (iVar2 == 0) {
                              PVar1 = CMP0063;
                            }
                            else {
                              iVar2 = strcmp(policy_id,"CMP0065");
                              if (iVar2 != 0) {
                                __assert_fail("0 && \"Unreachable code. Not a valid policy\"",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmGeneratorExpressionNode.cxx"
                                              ,0x5bd,
                                              "cmPolicies::PolicyID policyForString(const char *)");
                              }
                              PVar1 = CMP0065;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return PVar1;
}

Assistant:

cmPolicies::PolicyID policyForString(const char *policy_id)
{
#define RETURN_POLICY_ID(POLICY_ID) \
  if (strcmp(policy_id, #POLICY_ID) == 0) \
  { \
    return cmPolicies:: POLICY_ID; \
  } \

  CM_FOR_EACH_TARGET_POLICY(RETURN_POLICY_ID)

#undef RETURN_POLICY_ID

  assert(0 && "Unreachable code. Not a valid policy");
  return cmPolicies::CMP0002;
}